

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDriver.c
# Opt level: O0

int LaunchLabExecutable(char *labExe)

{
  int iVar1;
  undefined1 local_148 [4];
  int retCode;
  sigaction old;
  sigaction new;
  char *labExe_local;
  
  new.sa_restorer = (_func_void *)labExe;
  memset(&old.sa_restorer,0,0x98);
  old.sa_restorer = SigchldTrap;
  sigemptyset((sigset_t *)&new);
  new.sa_mask.__val[0xf]._0_4_ = 1;
  iVar1 = sigaction(0x11,(sigaction *)&old.sa_restorer,(sigaction *)local_148);
  if (iVar1 == 0) {
    labExe_local._4_4_ = _LaunchLabExecutable((char *)new.sa_restorer);
    iVar1 = sigaction(0x11,(sigaction *)local_148,(sigaction *)0x0);
    if (iVar1 != 0) {
      ReportSystemError("sigaction");
      labExe_local._4_4_ = -1;
    }
  }
  else {
    ReportSystemError("sigaction");
    labExe_local._4_4_ = -1;
  }
  return labExe_local._4_4_;
}

Assistant:

static int LaunchLabExecutable(char* labExe) {
    struct sigaction new = {0};
    new.sa_handler = SigchldTrap;
    (void)sigemptyset(&new.sa_mask); // не умеет завершаться неуспешно
    new.sa_flags = SA_NOCLDSTOP; // Не используем SA_RESETHAND, чтобы не зависеть от использования fork вне LaunchLabExecutable
    struct sigaction old;
    if (sigaction(SIGCHLD, &new, &old)) {
        ReportSystemError("sigaction");
        return -1;
    }

    int retCode = _LaunchLabExecutable(labExe);
    if (sigaction(SIGCHLD, &old, NULL)) {
        ReportSystemError("sigaction");
        return -1;
    }

    return retCode;
}